

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O0

void __thiscall Modifiers_Init_Test::TestBody(Modifiers_Init_Test *this)

{
  bool bVar1;
  enumeration *peVar2;
  char *pcVar3;
  AssertHelper local_1f0;
  Message local_1e8;
  enumeration local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  initializer<(anonymous_namespace)::enumeration> local_1c0;
  undefined1 local_1b8 [8];
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_b;
  Message local_100 [3];
  enumeration local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  initializer<(anonymous_namespace)::enumeration> local_c8;
  undefined1 local_c0 [8];
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_a;
  Modifiers_Init_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  opt_a.parser_.super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  local_c8 = pstore::command_line::init<(anonymous_namespace)::enumeration>
                       ((enumeration *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4));
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
  ::opt<pstore::command_line::details::initializer<(anonymous_namespace)::enumeration>>
            ((opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
              *)local_c0,&local_c8);
  peVar2 = pstore::command_line::
           opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
           ::get((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                  *)local_c0);
  local_e4 = a;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)local_e0,"opt_a.get ()","enumeration::a",peVar2,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&opt_b.parser_.super_parser_base.literals_.
                       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                       ._M_impl.super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&opt_b.parser_.super_parser_base.literals_.
                       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                       ._M_impl.super__Vector_impl_data + 0x10),local_100);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&opt_b.parser_.super_parser_base.literals_.
                       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  local_1c0 = pstore::command_line::init<(anonymous_namespace)::enumeration>
                        ((enumeration *)
                         ((long)&gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 4));
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
  ::opt<pstore::command_line::details::initializer<(anonymous_namespace)::enumeration>>
            ((opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
              *)local_1b8,&local_1c0);
  peVar2 = pstore::command_line::
           opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
           ::get((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                  *)local_1b8);
  local_1dc = b;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)local_1d8,"opt_b.get ()","enumeration::b",peVar2,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  ::~opt((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
          *)local_1b8);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  ::~opt((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
          *)local_c0);
  return;
}

Assistant:

TEST_F (Modifiers, Init) {
    // init() allows the initial (default) value of the option to be described.
    opt<enumeration> opt_a (init (enumeration::a));

    EXPECT_EQ (opt_a.get (), enumeration::a);

    opt<enumeration> opt_b (init (enumeration::b));
    EXPECT_EQ (opt_b.get (), enumeration::b);
}